

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

int zonephrase(gdstate *gds)

{
  gdstate *gds_local;
  
  if ((gds->tokenp->token == 0x10c) && (gds->tokenp[1].token == 0x10d)) {
    gds->HaveZone = gds->HaveZone + 1;
    gds->Timezone = gds->tokenp->value;
    gds->DSTmode = DSTon;
    gds->tokenp = gds->tokenp + 1;
    gds_local._4_4_ = 1;
  }
  else if (gds->tokenp->token == 0x10c) {
    gds->HaveZone = gds->HaveZone + 1;
    gds->Timezone = gds->tokenp->value;
    gds->DSTmode = DSToff;
    gds->tokenp = gds->tokenp + 1;
    gds_local._4_4_ = 1;
  }
  else if (gds->tokenp->token == 0x106) {
    gds->HaveZone = gds->HaveZone + 1;
    gds->Timezone = gds->tokenp->value;
    gds->DSTmode = DSTon;
    gds->tokenp = gds->tokenp + 1;
    gds_local._4_4_ = 1;
  }
  else {
    gds_local._4_4_ = 0;
  }
  return gds_local._4_4_;
}

Assistant:

static int
zonephrase(struct gdstate *gds)
{
	if (gds->tokenp[0].token == tZONE
	    && gds->tokenp[1].token == tDST) {
		gds->HaveZone++;
		gds->Timezone = gds->tokenp[0].value;
		gds->DSTmode = DSTon;
		gds->tokenp += 1;
		return 1;
	}

	if (gds->tokenp[0].token == tZONE) {
		gds->HaveZone++;
		gds->Timezone = gds->tokenp[0].value;
		gds->DSTmode = DSToff;
		gds->tokenp += 1;
		return 1;
	}

	if (gds->tokenp[0].token == tDAYZONE) {
		gds->HaveZone++;
		gds->Timezone = gds->tokenp[0].value;
		gds->DSTmode = DSTon;
		gds->tokenp += 1;
		return 1;
	}
	return 0;
}